

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Balance(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  uint fStrict;
  uint fVerbose;
  uint fVeryVerbose;
  uint local_48;
  uint local_44;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  local_44 = 1000000000;
  local_48 = 0;
  fStrict = 0;
  fVerbose = 0;
  fVeryVerbose = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        do {
          iVar2 = Extra_UtilGetopt(argc,argv,"Ndaslvwh");
          iVar6 = globalUtilOptind;
        } while (iVar2 == 0x6c);
        if (iVar2 < 100) break;
        if (iVar2 < 0x76) {
          if (iVar2 == 100) {
            bVar1 = (bool)(bVar1 ^ 1);
          }
          else {
            if (iVar2 != 0x73) goto LAB_0027bdb0;
            fStrict = fStrict ^ 1;
          }
        }
        else if (iVar2 == 0x76) {
          fVerbose = fVerbose ^ 1;
        }
        else {
          if (iVar2 != 0x77) goto LAB_0027bdb0;
          fVeryVerbose = fVeryVerbose ^ 1;
        }
      }
      if (iVar2 == -1) {
        pGVar3 = pAbc->pGia;
        if (pGVar3 != (Gia_Man_t *)0x0) {
          if (bVar1) {
            pGVar3 = Gia_ManBalance(pGVar3,local_48,fStrict,fVerbose);
          }
          else {
            pGVar3 = Gia_ManAreaBalance(pGVar3,local_48,local_44,fVerbose,fVeryVerbose);
          }
          Abc_FrameUpdateGia(pAbc,pGVar3);
          return 0;
        }
        pcVar4 = "Abc_CommandAbc9Balance(): There is no AIG.\n";
        iVar6 = -1;
        goto LAB_0027be9d;
      }
      if (iVar2 == 0x4e) break;
      if (iVar2 != 0x61) goto LAB_0027bdb0;
      local_48 = local_48 ^ 1;
    }
    if (argc <= globalUtilOptind) break;
    local_44 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar6 + 1;
    if ((int)local_44 < 0) {
LAB_0027bdb0:
      Abc_Print(-2,"usage: &b [-N num] [-dasvwh]\n");
      Abc_Print(-2,"\t         performs AIG balancing to reduce delay and area\n");
      Abc_Print(-2,"\t-N num : the max fanout count to skip a divisor [default = %d]\n",
                (ulong)local_44);
      pcVar5 = "yes";
      pcVar4 = "yes";
      if (!bVar1) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle delay only balancing [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_48 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-a     : toggle using AND instead of AND/XOR/MUX [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (fStrict == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,
                "\t-s     : toggle strict control of area in delay-mode (\"&b -d\") [default = %s]\n"
                ,pcVar4);
      pcVar4 = "yes";
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar4);
      if (fVeryVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-w     : toggle printing additional information [default = %s]\n",pcVar5);
      pcVar4 = "\t-h     : print the command usage\n";
      iVar6 = -2;
LAB_0027be9d:
      Abc_Print(iVar6,pcVar4);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-N\" should be followed by a char string.\n");
  goto LAB_0027bdb0;
}

Assistant:

int Abc_CommandAbc9Balance( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp = NULL;
    int nNewNodesMax = ABC_INFINITY;
    int fDelayOnly   = 0;
    int fSimpleAnd   = 0;
    int fStrict      = 0;
    int fKeepLevel   = 0;
    int c, fVerbose  = 0;
    int fVeryVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Ndaslvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a char string.\n" );
                goto usage;
            }
            nNewNodesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nNewNodesMax < 0 )
                goto usage;
            break;
        case 'd':
            fDelayOnly ^= 1;
            break;
        case 'a':
            fSimpleAnd ^= 1;
            break;
        case 's':
            fStrict ^= 1;
            break;
        case 'l':
            fKeepLevel ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Balance(): There is no AIG.\n" );
        return 1;
    }
    if ( fDelayOnly )
        pTemp = Gia_ManBalance( pAbc->pGia, fSimpleAnd, fStrict, fVerbose );
    else
        pTemp = Gia_ManAreaBalance( pAbc->pGia, fSimpleAnd, nNewNodesMax, fVerbose, fVeryVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &b [-N num] [-dasvwh]\n" );
    Abc_Print( -2, "\t         performs AIG balancing to reduce delay and area\n" );
    Abc_Print( -2, "\t-N num : the max fanout count to skip a divisor [default = %d]\n", nNewNodesMax );
    Abc_Print( -2, "\t-d     : toggle delay only balancing [default = %s]\n", fDelayOnly? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle using AND instead of AND/XOR/MUX [default = %s]\n", fSimpleAnd? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle strict control of area in delay-mode (\"&b -d\") [default = %s]\n", fStrict? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing additional information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}